

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

libssh2_socket_t open_socket_to_openssh_server(void)

{
  libssh2_socket_t lVar1;
  
  lVar1 = open_socket_to_container(running_container_id);
  return lVar1;
}

Assistant:

libssh2_socket_t open_socket_to_openssh_server(void)
{
    return open_socket_to_container(running_container_id);
}